

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::BufferRenderer::BufferRenderer
          (BufferRenderer *this,TestLog *log,RenderContext *renderContext)

{
  RenderContext *pRVar1;
  bool bVar2;
  ContextType type;
  GLenum GVar3;
  ShaderProgram *this_00;
  TestError *this_01;
  allocator<char> local_13a;
  allocator<char> local_139;
  string local_138;
  string local_118;
  ProgramSources local_f8;
  
  this->m_program = (ShaderProgram *)0x0;
  this->m_renderCtx = renderContext;
  this->m_coordBuffer = 0;
  this->m_indexBuffer = 0;
  this->m_vao = 0;
  type.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
  bVar2 = glu::isGLSLVersionSupported(type,GLSL_VERSION_300_ES);
  if (bVar2) {
    this_00 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = this->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,s_vertexShaderGLES3,&local_139);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,s_fragmentShaderGLES3,&local_13a);
    glu::makeVtxFragSources(&local_f8,&local_118,&local_138);
    glu::ShaderProgram::ShaderProgram(this_00,pRVar1,&local_f8);
  }
  else {
    bVar2 = glu::isGLSLVersionSupported(type,GLSL_VERSION_100_ES);
    if (bVar2) {
      this_00 = (ShaderProgram *)operator_new(0xd0);
      pRVar1 = this->m_renderCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,s_vertexShaderGLES2,&local_139);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,s_fragmentShaderGLES2,&local_13a);
      glu::makeVtxFragSources(&local_f8,&local_118,&local_138);
      glu::ShaderProgram::ShaderProgram(this_00,pRVar1,&local_f8);
    }
    else {
      bVar2 = glu::isGLSLVersionSupported(type,GLSL_VERSION_330);
      if (!bVar2) goto LAB_00443f27;
      this_00 = (ShaderProgram *)operator_new(0xd0);
      pRVar1 = this->m_renderCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,s_vertexShaderGL3,&local_139);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,s_fragmentShaderGL3,&local_13a);
      glu::makeVtxFragSources(&local_f8,&local_118,&local_138);
      glu::ShaderProgram::ShaderProgram(this_00,pRVar1,&local_f8);
    }
  }
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_f8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
LAB_00443f27:
  if (((uint)type.super_ApiType.m_bits & 0x300) == 0x100) {
    glwGenVertexArrays(1,&this->m_vao);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glGenVertexArrays(1, &m_vao)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x166);
  }
  glwGenBuffers(1,&this->m_coordBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glGenBuffers(1, &m_coordBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x168);
  glwBindBuffer(0x8892,this->m_coordBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x169);
  glwBufferData(0x8892,0x20,s_quadCoords,0x88e4);
  GVar3 = glwGetError();
  glu::checkError(GVar3,
                  "glBufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16a);
  glwGenBuffers(1,&this->m_indexBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glGenBuffers(1, &m_indexBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16c);
  glwBindBuffer(0x8893,this->m_indexBuffer);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16d);
  glwBufferData(0x8893,6,&s_quadIndices,0x88e4);
  GVar3 = glwGetError();
  glu::checkError(GVar3,
                  "glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(s_quadIndices), s_quadIndices, GL_STATIC_DRAW)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x16e);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    glu::operator<<(log,this->m_program);
    if ((this->m_program->m_program).m_info.linkOk == false) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Shader compilation failed","m_program->isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                 ,0x173);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

BufferRenderer::BufferRenderer (tcu::TestLog& log, glu::RenderContext& renderContext)
	: m_program		(NULL)
	, m_renderCtx	(renderContext)
	, m_coordBuffer	(0)
	, m_indexBuffer	(0)
	, m_vao			(0)
{
	const glu::ContextType ctxType = renderContext.getType();

	if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_300_ES))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGLES3, s_fragmentShaderGLES3));
	else if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_100_ES))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGLES2, s_fragmentShaderGLES2));
	else if (glu::isGLSLVersionSupported(ctxType, glu::GLSL_VERSION_330))
		m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(s_vertexShaderGL3, s_fragmentShaderGL3));
	else
		DE_ASSERT(false);

	if (ctxType.getProfile() == glu::PROFILE_CORE)
		GLU_CHECK_CALL(glGenVertexArrays(1, &m_vao));

	GLU_CHECK_CALL(glGenBuffers(1, &m_coordBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer));
	GLU_CHECK_CALL(glBufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW));

	GLU_CHECK_CALL(glGenBuffers(1, &m_indexBuffer));
	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer));
	GLU_CHECK_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(s_quadIndices), s_quadIndices, GL_STATIC_DRAW));

	if (!m_program->isOk())
	{
		log << *m_program;
		TCU_CHECK_MSG(m_program->isOk(), "Shader compilation failed");
	}
}